

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftcalc.c
# Opt level: O2

void FT_Matrix_Multiply_Scaled(FT_Matrix *a,FT_Matrix *b,FT_Long scaling)

{
  FT_Long FVar1;
  FT_Long b_;
  FT_Long FVar2;
  FT_Long FVar3;
  FT_Long FVar4;
  FT_Long FVar5;
  FT_Long FVar6;
  FT_Long FVar7;
  FT_Long FVar8;
  FT_Long FVar9;
  long c_;
  
  if (b != (FT_Matrix *)0x0 && a != (FT_Matrix *)0x0) {
    c_ = scaling << 0x10;
    FVar9 = a->xx;
    FVar1 = b->xx;
    FVar2 = FT_MulDiv(FVar9,FVar1,c_);
    FVar8 = a->xy;
    FVar7 = b->yx;
    FVar3 = FT_MulDiv(FVar8,FVar7,c_);
    b_ = b->xy;
    FVar4 = FT_MulDiv(FVar9,b_,c_);
    FVar9 = b->yy;
    FVar5 = FT_MulDiv(FVar8,FVar9,c_);
    FVar8 = a->yx;
    FVar6 = FT_MulDiv(FVar8,FVar1,c_);
    FVar1 = a->yy;
    FVar7 = FT_MulDiv(FVar1,FVar7,c_);
    FVar8 = FT_MulDiv(FVar8,b_,c_);
    FVar9 = FT_MulDiv(FVar1,FVar9,c_);
    b->xx = FVar3 + FVar2;
    b->xy = FVar5 + FVar4;
    b->yx = FVar7 + FVar6;
    b->yy = FVar9 + FVar8;
  }
  return;
}

Assistant:

FT_BASE_DEF( void )
  FT_Matrix_Multiply_Scaled( const FT_Matrix*  a,
                             FT_Matrix        *b,
                             FT_Long           scaling )
  {
    FT_Fixed  xx, xy, yx, yy;

    FT_Long   val = 0x10000L * scaling;


    if ( !a || !b )
      return;

    xx = ADD_LONG( FT_MulDiv( a->xx, b->xx, val ),
                   FT_MulDiv( a->xy, b->yx, val ) );
    xy = ADD_LONG( FT_MulDiv( a->xx, b->xy, val ),
                   FT_MulDiv( a->xy, b->yy, val ) );
    yx = ADD_LONG( FT_MulDiv( a->yx, b->xx, val ),
                   FT_MulDiv( a->yy, b->yx, val ) );
    yy = ADD_LONG( FT_MulDiv( a->yx, b->xy, val ),
                   FT_MulDiv( a->yy, b->yy, val ) );

    b->xx = xx;
    b->xy = xy;
    b->yx = yx;
    b->yy = yy;
  }